

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

bool __thiscall
fmt::v11::format_facet<std::locale>::do_put
          (format_facet<std::locale> *this,appender out,loc_value val,format_specs *specs)

{
  pointer pcVar1;
  bool bVar2;
  undefined1 local_90 [16];
  _Alloc_hider local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  _Alloc_hider local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  _Alloc_hider local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  pcVar1 = (this->separator_)._M_dataplus._M_p;
  local_90._0_8_ = out.container;
  local_90._8_8_ = specs;
  local_80._M_p = (pointer)&local_70;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,pcVar1,pcVar1 + (this->separator_)._M_string_length);
  pcVar1 = (this->grouping_)._M_dataplus._M_p;
  local_60._M_p = (pointer)&local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + (this->grouping_)._M_string_length);
  pcVar1 = (this->decimal_point_)._M_dataplus._M_p;
  local_40._M_p = (pointer)&local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + (this->decimal_point_)._M_string_length);
  bVar2 = loc_value::visit<fmt::v11::detail::loc_writer<char>>(&val,(loc_writer<char> *)local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_p != &local_30) {
    operator_delete(local_40._M_p,local_30._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_p != &local_50) {
    operator_delete(local_60._M_p,local_50._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_p != &local_70) {
    operator_delete(local_80._M_p,local_70._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

FMT_API FMT_FUNC auto format_facet<std::locale>::do_put(
    appender out, loc_value val, const format_specs& specs) const -> bool {
  return val.visit(
      detail::loc_writer<>{out, specs, separator_, grouping_, decimal_point_});
}